

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFWriter.cpp
# Opt level: O2

EStatusCode __thiscall
PDFWriter::SetupStateFromModifiedStream
          (PDFWriter *this,IByteReaderWithPosition *inModifiedSourceStream,EPDFVersion inPDFVersion,
          PDFCreationSettings *inPDFCreationSettings)

{
  PDFParser *this_00;
  DocumentContext *this_01;
  bool bVar1;
  EStatusCode EVar2;
  EPDFVersion EVar3;
  PDFParsingOptions parsingOptions;
  
  EVar3 = inPDFCreationSettings->WriteXrefAsXrefStream | ePDFVersion14;
  if (inPDFVersion != ePDFVersionUndefined) {
    EVar3 = inPDFVersion;
  }
  parsingOptions.Password._M_dataplus._M_p = (pointer)&parsingOptions.Password.field_2;
  parsingOptions.Password._M_string_length = 0;
  parsingOptions.Password.field_2._M_local_buf[0] = '\0';
  if ((inPDFCreationSettings->DocumentEncryptionOptions).ShouldEncrypt == true) {
    std::__cxx11::string::_M_assign((string *)&parsingOptions);
  }
  this_00 = &this->mModifiedFileParser;
  EVar2 = PDFParser::StartPDFParsing(this_00,inModifiedSourceStream,&parsingOptions);
  if (EVar2 == eSuccess) {
    ObjectsContext::SetupModifiedFile(&this->mObjectsContext,this_00);
    this_01 = &this->mDocumentContext;
    EVar2 = PDFHummus::DocumentContext::SetupModifiedFile(this_01,this_00);
    if (EVar2 == eSuccess) {
      bVar1 = PDFParser::IsEncrypted(this_00);
      if (bVar1) {
        bVar1 = PDFParser::IsEncryptionSupported(this_00);
        if (bVar1) {
          PDFHummus::DocumentContext::SetupEncryption(this_01,this_00);
          bVar1 = PDFHummus::DocumentContext::SupportsEncryption(this_01);
          if (!bVar1) {
            EVar2 = eFailure;
            goto LAB_001ac7d1;
          }
        }
      }
      this->mModifiedFileVersion = EVar3;
      EVar2 = eSuccess;
    }
  }
LAB_001ac7d1:
  std::__cxx11::string::~string((string *)&parsingOptions);
  return EVar2;
}

Assistant:

EStatusCode PDFWriter::SetupStateFromModifiedStream(IByteReaderWithPosition* inModifiedSourceStream,
                                                    EPDFVersion inPDFVersion,
													const PDFCreationSettings& inPDFCreationSettings)
{
	EPDFVersion pdfVersion = thisOrDefaultVersion(inPDFVersion, inPDFCreationSettings.WriteXrefAsXrefStream);
    EStatusCode status;
	PDFParsingOptions parsingOptions;

	// this bit here is actually interesting. in order to modify an already encrypted document
	// and add more content to it, i just need the user password. not the owner one.
	// in fact, passing the owner password here will create the wrong encryption key.
	// interesting.
	if (inPDFCreationSettings.DocumentEncryptionOptions.ShouldEncrypt)
		parsingOptions.Password = inPDFCreationSettings.DocumentEncryptionOptions.UserPassword;

    do
    {
        status = mModifiedFileParser.StartPDFParsing(inModifiedSourceStream, parsingOptions);
        if(status != eSuccess)
            break;

        mObjectsContext.SetupModifiedFile(&mModifiedFileParser);

        status = mDocumentContext.SetupModifiedFile(&mModifiedFileParser);
        if(status != eSuccess)
            break;

		if (mModifiedFileParser.IsEncrypted() && mModifiedFileParser.IsEncryptionSupported()) {
			mDocumentContext.SetupEncryption(&mModifiedFileParser);
			if (!mDocumentContext.SupportsEncryption()) {
				status = eFailure;
				break;
			}
		}

        mModifiedFileVersion = pdfVersion;
    }
    while (false);

    return status;
}